

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowTitleBarContents
               (ImGuiWindow *window,ImRect *title_bar_rect,char *name,bool *p_open)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  undefined1 *in_RCX;
  ImRect *in_RSI;
  long in_RDI;
  float _x;
  float fVar4;
  ImVec2 IVar5;
  ImVec2 marker_pos;
  ImRect clip_r;
  ImRect layout_r;
  float pad_extend;
  float centerness;
  ImVec2 text_size;
  float marker_size_x;
  ImVec2 collapse_button_pos;
  ImVec2 close_button_pos;
  float button_sz;
  float pad_r;
  float pad_l;
  ImGuiItemFlags item_flags_backup;
  bool has_collapse_button;
  bool has_close_button;
  ImGuiWindowFlags flags;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImDrawList *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint3 in_stack_ffffffffffffff34;
  uint uVar6;
  ImVec2 *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float mn;
  float in_stack_ffffffffffffff60;
  float fVar7;
  float in_stack_ffffffffffffff64;
  float local_98;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float local_7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  float local_70;
  float in_stack_ffffffffffffff94;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  float local_48;
  float local_44;
  float local_40;
  ImGuiItemFlags local_3c;
  byte local_36;
  byte local_35;
  uint local_34;
  ImGuiStyle *local_30;
  ImGuiContext *local_28;
  undefined1 *local_20;
  ImRect *local_10;
  long local_8;
  
  pIVar1 = GImGui;
  local_28 = GImGui;
  local_30 = &GImGui->Style;
  local_34 = *(uint *)(in_RDI + 0xc);
  local_35 = in_RCX != (undefined1 *)0x0;
  uVar6 = (uint)in_stack_ffffffffffffff34;
  if ((local_34 & 0x20) == 0) {
    uVar6 = CONCAT13((GImGui->Style).WindowMenuButtonPosition != -1,in_stack_ffffffffffffff34);
  }
  local_36 = (byte)(uVar6 >> 0x18);
  local_3c = GImGui->CurrentItemFlags;
  GImGui->CurrentItemFlags = GImGui->CurrentItemFlags | 0x10;
  *(undefined4 *)(in_RDI + 0x138) = 1;
  local_40 = (pIVar1->Style).FramePadding.x;
  local_44 = (pIVar1->Style).FramePadding.x;
  local_48 = pIVar1->FontSize;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ImVec2::ImVec2(&local_50);
  ImVec2::ImVec2(&local_58);
  if ((local_35 & 1) != 0) {
    local_44 = local_48 + local_44;
    ImVec2::ImVec2(&local_60,((local_10->Max).x - local_44) - (local_30->FramePadding).x,
                   (local_10->Min).y);
    local_50 = local_60;
  }
  if (((local_36 & 1) != 0) && (local_30->WindowMenuButtonPosition == 1)) {
    local_44 = local_48 + local_44;
    ImVec2::ImVec2(&local_68,((local_10->Max).x - local_44) - (local_30->FramePadding).x,
                   (local_10->Min).y);
    local_58 = local_68;
  }
  if (((local_36 & 1) != 0) && (local_30->WindowMenuButtonPosition == 0)) {
    ImVec2::ImVec2((ImVec2 *)&local_70,((local_10->Min).x + local_40) - (local_30->FramePadding).x,
                   (local_10->Min).y);
    local_58.y = in_stack_ffffffffffffff94;
    local_58.x = local_70;
    local_40 = local_48 + local_40;
  }
  if ((local_36 & 1) != 0) {
    ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(uVar6,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff28,
                       (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    bVar2 = CollapseButton((ImGuiID)in_stack_ffffffffffffff94,
                           (ImVec2 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (bVar2) {
      *(undefined1 *)(local_8 + 0x9a) = 1;
    }
  }
  if ((local_35 & 1) != 0) {
    ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(uVar6,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff28,
                       (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    bVar2 = CloseButton((ImGuiID)layout_r.Max.y,(ImVec2 *)layout_r._4_8_);
    if (bVar2) {
      *local_20 = 0;
    }
  }
  *(undefined4 *)(local_8 + 0x138) = 0;
  local_28->CurrentItemFlags = local_3c;
  if ((local_34 & 0x100000) == 0) {
    _x = 0.0;
  }
  else {
    _x = local_48 * 0.8;
  }
  CalcTextSize((char *)in_stack_ffffffffffffff38,(char *)CONCAT44(uVar6,_x),
               SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0),SUB84(in_stack_ffffffffffffff28,0))
  ;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff74,_x,0.0);
  IVar5 = ::operator+((ImVec2 *)in_stack_ffffffffffffff08,(ImVec2 *)0x4a3d9b);
  local_7c = IVar5.x;
  if ((local_30->FramePadding).x <= local_40 && local_40 != (local_30->FramePadding).x) {
    local_40 = (local_28->Style).ItemInnerSpacing.x + local_40;
  }
  if ((local_30->FramePadding).x <= local_44 && local_44 != (local_30->FramePadding).x) {
    local_44 = (local_28->Style).ItemInnerSpacing.x + local_44;
  }
  if ((0.0 < (local_30->WindowTitleAlign).x) &&
     ((local_30->WindowTitleAlign).x <= 1.0 && (local_30->WindowTitleAlign).x != 1.0)) {
    fVar3 = -ABS((local_30->WindowTitleAlign).x - 0.5);
    in_stack_ffffffffffffff70 = ImSaturate(fVar3 + fVar3 + 1.0);
    in_stack_ffffffffffffff24 = ImMax<float>(local_40,local_44);
    fVar3 = ImRect::GetWidth(local_10);
    fVar3 = ImMin<float>(in_stack_ffffffffffffff24,((fVar3 - local_40) - local_44) - local_7c);
    local_40 = ImMax<float>(local_40,fVar3 * in_stack_ffffffffffffff70);
    local_44 = ImMax<float>(local_44,fVar3 * in_stack_ffffffffffffff70);
  }
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                 (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),(float)in_stack_ffffffffffffff10)
  ;
  fVar3 = in_stack_ffffffffffffff5c;
  fVar7 = in_stack_ffffffffffffff60;
  ImMin<float>(in_stack_ffffffffffffff64 + (local_28->Style).ItemInnerSpacing.x,(local_10->Max).x);
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff5c),
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff18,
                 (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),(float)in_stack_ffffffffffffff10)
  ;
  mn = fVar3;
  if ((local_34 & 0x100000) != 0) {
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff44);
    mn = fVar3;
    fVar4 = ImRect::GetWidth((ImRect *)&stack0xffffffffffffff5c);
    in_stack_ffffffffffffff44 =
         ImClamp<float>((fVar4 - local_7c) * (local_30->WindowTitleAlign).x + fVar3 + local_7c,mn,
                        in_stack_ffffffffffffff64);
    in_stack_ffffffffffffff48 = (fVar7 + local_98) * 0.5;
    if (mn < in_stack_ffffffffffffff44) {
      IVar5 = *(ImVec2 *)(local_8 + 0x278);
      in_stack_ffffffffffffff38 =
           (ImVec2 *)CONCAT44(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      GetColorU32((ImGuiCol)in_stack_ffffffffffffff24,in_stack_ffffffffffffff5c);
      RenderBullet(in_stack_ffffffffffffff08,IVar5,0);
      in_stack_ffffffffffffff54 =
           ImMin<float>(in_stack_ffffffffffffff54,in_stack_ffffffffffffff44 - (float)(int)(_x * 0.5)
                       );
    }
  }
  RenderTextClipped((ImVec2 *)CONCAT44(in_stack_ffffffffffffff64,fVar7),
                    (ImVec2 *)CONCAT44(mn,in_stack_ffffffffffffff58),
                    (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                    (ImVec2 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    in_stack_ffffffffffffff38,
                    (ImRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return;
}

Assistant:

void ImGui::RenderWindowTitleBarContents(ImGuiWindow* window, const ImRect& title_bar_rect, const char* name, bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImGuiWindowFlags flags = window->Flags;

    const bool has_close_button = (p_open != NULL);
    const bool has_collapse_button = !(flags & ImGuiWindowFlags_NoCollapse) && (style.WindowMenuButtonPosition != ImGuiDir_None);

    // Close & Collapse button are on the Menu NavLayer and don't default focus (unless there's nothing else on that layer)
    // FIXME-NAV: Might want (or not?) to set the equivalent of ImGuiButtonFlags_NoNavFocus so that mouse clicks on standard title bar items don't necessarily set nav/keyboard ref?
    const ImGuiItemFlags item_flags_backup = g.CurrentItemFlags;
    g.CurrentItemFlags |= ImGuiItemFlags_NoNavDefaultFocus;
    window->DC.NavLayerCurrent = ImGuiNavLayer_Menu;

    // Layout buttons
    // FIXME: Would be nice to generalize the subtleties expressed here into reusable code.
    float pad_l = style.FramePadding.x;
    float pad_r = style.FramePadding.x;
    float button_sz = g.FontSize;
    ImVec2 close_button_pos;
    ImVec2 collapse_button_pos;
    if (has_close_button)
    {
        pad_r += button_sz;
        close_button_pos = ImVec2(title_bar_rect.Max.x - pad_r - style.FramePadding.x, title_bar_rect.Min.y);
    }
    if (has_collapse_button && style.WindowMenuButtonPosition == ImGuiDir_Right)
    {
        pad_r += button_sz;
        collapse_button_pos = ImVec2(title_bar_rect.Max.x - pad_r - style.FramePadding.x, title_bar_rect.Min.y);
    }
    if (has_collapse_button && style.WindowMenuButtonPosition == ImGuiDir_Left)
    {
        collapse_button_pos = ImVec2(title_bar_rect.Min.x + pad_l - style.FramePadding.x, title_bar_rect.Min.y);
        pad_l += button_sz;
    }

    // Collapse button (submitting first so it gets priority when choosing a navigation init fallback)
    if (has_collapse_button)
        if (CollapseButton(window->GetID("#COLLAPSE"), collapse_button_pos))
            window->WantCollapseToggle = true; // Defer actual collapsing to next frame as we are too far in the Begin() function

    // Close button
    if (has_close_button)
        if (CloseButton(window->GetID("#CLOSE"), close_button_pos))
            *p_open = false;

    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;
    g.CurrentItemFlags = item_flags_backup;

    // Title bar text (with: horizontal alignment, avoiding collapse/close button, optional "unsaved document" marker)
    // FIXME: Refactor text alignment facilities along with RenderText helpers, this is WAY too much messy code..
    const float marker_size_x = (flags & ImGuiWindowFlags_UnsavedDocument) ? button_sz * 0.80f : 0.0f;
    const ImVec2 text_size = CalcTextSize(name, NULL, true) + ImVec2(marker_size_x, 0.0f);

    // As a nice touch we try to ensure that centered title text doesn't get affected by visibility of Close/Collapse button,
    // while uncentered title text will still reach edges correctly.
    if (pad_l > style.FramePadding.x)
        pad_l += g.Style.ItemInnerSpacing.x;
    if (pad_r > style.FramePadding.x)
        pad_r += g.Style.ItemInnerSpacing.x;
    if (style.WindowTitleAlign.x > 0.0f && style.WindowTitleAlign.x < 1.0f)
    {
        float centerness = ImSaturate(1.0f - ImFabs(style.WindowTitleAlign.x - 0.5f) * 2.0f); // 0.0f on either edges, 1.0f on center
        float pad_extend = ImMin(ImMax(pad_l, pad_r), title_bar_rect.GetWidth() - pad_l - pad_r - text_size.x);
        pad_l = ImMax(pad_l, pad_extend * centerness);
        pad_r = ImMax(pad_r, pad_extend * centerness);
    }

    ImRect layout_r(title_bar_rect.Min.x + pad_l, title_bar_rect.Min.y, title_bar_rect.Max.x - pad_r, title_bar_rect.Max.y);
    ImRect clip_r(layout_r.Min.x, layout_r.Min.y, ImMin(layout_r.Max.x + g.Style.ItemInnerSpacing.x, title_bar_rect.Max.x), layout_r.Max.y);
    if (flags & ImGuiWindowFlags_UnsavedDocument)
    {
        ImVec2 marker_pos;
        marker_pos.x = ImClamp(layout_r.Min.x + (layout_r.GetWidth() - text_size.x) * style.WindowTitleAlign.x + text_size.x, layout_r.Min.x, layout_r.Max.x);
        marker_pos.y = (layout_r.Min.y + layout_r.Max.y) * 0.5f;
        if (marker_pos.x > layout_r.Min.x)
        {
            RenderBullet(window->DrawList, marker_pos, GetColorU32(ImGuiCol_Text));
            clip_r.Max.x = ImMin(clip_r.Max.x, marker_pos.x - (int)(marker_size_x * 0.5f));
        }
    }
    //if (g.IO.KeyShift) window->DrawList->AddRect(layout_r.Min, layout_r.Max, IM_COL32(255, 128, 0, 255)); // [DEBUG]
    //if (g.IO.KeyCtrl) window->DrawList->AddRect(clip_r.Min, clip_r.Max, IM_COL32(255, 128, 0, 255)); // [DEBUG]
    RenderTextClipped(layout_r.Min, layout_r.Max, name, NULL, &text_size, style.WindowTitleAlign, &clip_r);
}